

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderNext(Fts3Table *p,Fts3SegReader *pReader,int bIncr)

{
  Fts3HashElem *pFVar1;
  int *piVar2;
  sqlite3_uint64 n;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  int *in_R8;
  size_t __n;
  char *pcVar10;
  int nPrefix;
  int nSuffix;
  long local_38;
  
  if (pReader->aDoclist == (char *)0x0) {
    pcVar10 = pReader->aNode;
  }
  else {
    pcVar10 = pReader->aDoclist + pReader->nDoclist;
  }
  if ((pcVar10 == (char *)0x0) || (pReader->aNode + pReader->nNode <= pcVar10)) {
    if (pReader->ppNextElem == (Fts3HashElem **)0x0) {
      fts3SegReaderSetEof(pReader);
      if (pReader->iLeafEndBlock <= pReader->iCurrentBlock) {
        return 0;
      }
      lVar9 = pReader->iCurrentBlock + 1;
      pReader->iCurrentBlock = lVar9;
      iVar3 = sqlite3Fts3ReadBlock(p,lVar9,&pReader->aNode,&pReader->nNode,in_R8);
      if (iVar3 != 0) {
        return iVar3;
      }
      pcVar10 = pReader->aNode;
      goto LAB_001b30a2;
    }
    pFVar1 = *pReader->ppNextElem;
    sqlite3_free(pReader->aNode);
    pReader->aNode = (char *)0x0;
    if (pFVar1 == (Fts3HashElem *)0x0) {
      return 0;
    }
    piVar2 = (int *)pFVar1->data;
    __n = (long)*piVar2 + 1;
    pReader->zTerm = (char *)pFVar1->pKey;
    pReader->nTerm = pFVar1->nKey;
    iVar3 = (int)__n;
    pcVar10 = (char *)sqlite3_malloc(iVar3);
    if (pcVar10 != (char *)0x0) {
      memcpy(pcVar10,*(void **)(piVar2 + 2),__n);
      pReader->nDoclist = iVar3;
      pReader->nNode = iVar3;
      pReader->aDoclist = pcVar10;
      pReader->aNode = pcVar10;
      pReader->ppNextElem = pReader->ppNextElem + 1;
      return 0;
    }
LAB_001b3273:
    iVar4 = 7;
  }
  else {
LAB_001b30a2:
    iVar3 = fts3SegReaderRequire(pReader,pcVar10,0x14);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (*pcVar10 < '\0') {
      uVar5 = sqlite3Fts3GetVarint32(pcVar10,&nPrefix);
      uVar6 = (ulong)uVar5;
    }
    else {
      uVar6 = 1;
      nPrefix = (int)*pcVar10;
    }
    if (pcVar10[uVar6] < '\0') {
      uVar5 = sqlite3Fts3GetVarint32(pcVar10 + uVar6,&nSuffix);
      uVar7 = (ulong)uVar5;
    }
    else {
      uVar7 = 1;
      nSuffix = (int)pcVar10[uVar6];
    }
    iVar3 = nSuffix;
    if (nSuffix < 1) {
      return 0x10b;
    }
    pcVar10 = pcVar10 + uVar6 + uVar7;
    uVar6 = (ulong)(uint)nSuffix;
    if ((long)(pReader->aNode + ((long)pReader->nNode - (long)pcVar10)) < (long)uVar6) {
      return 0x10b;
    }
    local_38 = (long)nPrefix;
    if (pReader->nTermAlloc < nPrefix) {
      return 0x10b;
    }
    if ((long)pReader->nTermAlloc < (long)(local_38 + uVar6)) {
      n = (local_38 + uVar6) * 2;
      pcVar8 = (char *)sqlite3_realloc64(pReader->zTerm,n);
      if (pcVar8 == (char *)0x0) goto LAB_001b3273;
      pReader->zTerm = pcVar8;
      pReader->nTermAlloc = (int)n;
    }
    iVar4 = fts3SegReaderRequire(pReader,pcVar10,iVar3 + 10);
    lVar9 = local_38;
    if (iVar4 == 0) {
      memcpy(pReader->zTerm + local_38,pcVar10,uVar6);
      pReader->nTerm = iVar3 + (int)lVar9;
      iVar3 = (int)pcVar10[uVar6];
      if (pcVar10[uVar6] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32(pcVar10 + uVar6,&pReader->nDoclist);
        uVar7 = (ulong)uVar5;
        iVar3 = pReader->nDoclist;
      }
      else {
        uVar7 = 1;
        pReader->nDoclist = iVar3;
      }
      pcVar10 = pcVar10 + uVar6 + uVar7;
      pReader->aDoclist = pcVar10;
      pReader->pOffsetList = (char *)0x0;
      iVar4 = 0x10b;
      if (((long)iVar3 <= (long)(pReader->aNode + ((long)pReader->nNode - (long)pcVar10))) &&
         ((pReader->nPopulate != 0 || (pcVar10[(long)iVar3 + -1] == '\0')))) {
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int fts3SegReaderNext(
  Fts3Table *p, 
  Fts3SegReader *pReader,
  int bIncr
){
  int rc;                         /* Return code of various sub-routines */
  char *pNext;                    /* Cursor variable */
  int nPrefix;                    /* Number of bytes in term prefix */
  int nSuffix;                    /* Number of bytes in term suffix */

  if( !pReader->aDoclist ){
    pNext = pReader->aNode;
  }else{
    pNext = &pReader->aDoclist[pReader->nDoclist];
  }

  if( !pNext || pNext>=&pReader->aNode[pReader->nNode] ){

    if( fts3SegReaderIsPending(pReader) ){
      Fts3HashElem *pElem = *(pReader->ppNextElem);
      sqlite3_free(pReader->aNode);
      pReader->aNode = 0;
      if( pElem ){
        char *aCopy;
        PendingList *pList = (PendingList *)fts3HashData(pElem);
        int nCopy = pList->nData+1;
        pReader->zTerm = (char *)fts3HashKey(pElem);
        pReader->nTerm = fts3HashKeysize(pElem);
        aCopy = (char*)sqlite3_malloc(nCopy);
        if( !aCopy ) return SQLITE_NOMEM;
        memcpy(aCopy, pList->aData, nCopy);
        pReader->nNode = pReader->nDoclist = nCopy;
        pReader->aNode = pReader->aDoclist = aCopy;
        pReader->ppNextElem++;
        assert( pReader->aNode );
      }
      return SQLITE_OK;
    }

    fts3SegReaderSetEof(pReader);

    /* If iCurrentBlock>=iLeafEndBlock, this is an EOF condition. All leaf 
    ** blocks have already been traversed.  */
#ifdef CORRUPT_DB
    assert( pReader->iCurrentBlock<=pReader->iLeafEndBlock || CORRUPT_DB );
#endif
    if( pReader->iCurrentBlock>=pReader->iLeafEndBlock ){
      return SQLITE_OK;
    }

    rc = sqlite3Fts3ReadBlock(
        p, ++pReader->iCurrentBlock, &pReader->aNode, &pReader->nNode, 
        (bIncr ? &pReader->nPopulate : 0)
    );
    if( rc!=SQLITE_OK ) return rc;
    assert( pReader->pBlob==0 );
    if( bIncr && pReader->nPopulate<pReader->nNode ){
      pReader->pBlob = p->pSegments;
      p->pSegments = 0;
    }
    pNext = pReader->aNode;
  }

  assert( !fts3SegReaderIsPending(pReader) );

  rc = fts3SegReaderRequire(pReader, pNext, FTS3_VARINT_MAX*2);
  if( rc!=SQLITE_OK ) return rc;
  
  /* Because of the FTS3_NODE_PADDING bytes of padding, the following is 
  ** safe (no risk of overread) even if the node data is corrupted. */
  pNext += fts3GetVarint32(pNext, &nPrefix);
  pNext += fts3GetVarint32(pNext, &nSuffix);
  if( nSuffix<=0 
   || (&pReader->aNode[pReader->nNode] - pNext)<nSuffix
   || nPrefix>pReader->nTermAlloc
  ){
    return FTS_CORRUPT_VTAB;
  }

  /* Both nPrefix and nSuffix were read by fts3GetVarint32() and so are
  ** between 0 and 0x7FFFFFFF. But the sum of the two may cause integer
  ** overflow - hence the (i64) casts.  */
  if( (i64)nPrefix+nSuffix>(i64)pReader->nTermAlloc ){
    i64 nNew = ((i64)nPrefix+nSuffix)*2;
    char *zNew = sqlite3_realloc64(pReader->zTerm, nNew);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pReader->zTerm = zNew;
    pReader->nTermAlloc = nNew;
  }

  rc = fts3SegReaderRequire(pReader, pNext, nSuffix+FTS3_VARINT_MAX);
  if( rc!=SQLITE_OK ) return rc;

  memcpy(&pReader->zTerm[nPrefix], pNext, nSuffix);
  pReader->nTerm = nPrefix+nSuffix;
  pNext += nSuffix;
  pNext += fts3GetVarint32(pNext, &pReader->nDoclist);
  pReader->aDoclist = pNext;
  pReader->pOffsetList = 0;

  /* Check that the doclist does not appear to extend past the end of the
  ** b-tree node. And that the final byte of the doclist is 0x00. If either 
  ** of these statements is untrue, then the data structure is corrupt.
  */
  if( pReader->nDoclist > pReader->nNode-(pReader->aDoclist-pReader->aNode)
   || (pReader->nPopulate==0 && pReader->aDoclist[pReader->nDoclist-1])
  ){
    return FTS_CORRUPT_VTAB;
  }
  return SQLITE_OK;
}